

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O1

SSTableData * __thiscall SSTable::getAllData(SSTable *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SSTableHeader *pSVar2;
  SSTableData *pSVar3;
  ulong uVar4;
  ifstream in;
  SSTableDataEntry local_278;
  istream local_230 [520];
  
  pSVar3 = this->data;
  if ((pSVar3 == (SSTableData *)0x0) ||
     ((pSVar3->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pSVar3->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    pSVar2 = getHeader(this);
    std::ifstream::ifstream(local_230,(this->file)._M_pathname._M_dataplus._M_p,_S_in|_S_bin);
    std::istream::seekg(local_230,0x20,0);
    pSVar3 = (SSTableData *)operator_new(0x18);
    (pSVar3->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar3->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar3->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->data = pSVar3;
    paVar1 = &local_278.value.field_2;
    local_278.value.field_2._8_8_ = 0;
    local_278.key = 0;
    local_278.value_length = 0;
    local_278.delete_flag = false;
    local_278._1_7_ = 0;
    local_278.timestamp = 0;
    local_278.value._M_string_length = 0;
    local_278.value.field_2._M_allocated_capacity = 0;
    local_278.value._M_dataplus._M_p = (pointer)paVar1;
    while( true ) {
      uVar4 = std::istream::tellg();
      if (pSVar2->index_offset <= uVar4) break;
      operator>>(local_230,&local_278);
      std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::
      emplace_back<SSTableDataEntry>(this->data,&local_278);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.value._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.value._M_dataplus._M_p,
                      local_278.value.field_2._M_allocated_capacity + 1);
    }
    std::ifstream::~ifstream(local_230);
  }
  return this->data;
}

Assistant:

SSTableData *SSTable::getAllData() {
    if (data == nullptr || data->empty()) {
        auto *h = getHeader();
        auto in = create_binary_ifstream(file);
        in.seekg(32); // Header always consume 32 bytes.
        data = new SSTableData{};
        auto temp = SSTableDataEntry{};
        while (in.tellg() < h->index_offset) {
            in >> temp;
            data->push_back(std::move(temp));
        }
    }
    return data;
}